

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

void __thiscall
draco::AttributeQuantizationTransform::GeneratePortableAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points,PointAttribute *target_attribute)

{
  undefined1 auVar1 [16];
  byte bVar2;
  AttributeValueIndex AVar3;
  ulong uVar4;
  size_type sVar5;
  type pfVar6;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RDX;
  GeometryAttribute *in_RSI;
  AttributeQuantizationTransform *in_RDI;
  float range;
  int32_t q_val;
  float value;
  int c;
  AttributeValueIndex att_val_id;
  uint32_t i;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  int32_t dst_index;
  Quantizer quantizer;
  uint32_t max_quantized_value;
  int32_t *portable_attribute_data;
  int num_components;
  int32_t in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff40;
  GeometryAttribute *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  GeometryAttribute *out_data;
  GeometryAttribute *this_00;
  int local_74;
  uint local_54;
  int local_48;
  Quantizer local_44;
  int local_40;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_3c;
  uint8_t *local_38;
  uint local_2c;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_18;
  GeometryAttribute *local_10;
  
  AVar3.value_ = (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = GeometryAttribute::num_components(in_RSI);
  local_2c = (uint)bVar2;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_3c,0);
  local_38 = GeometryAttribute::GetAddress(in_stack_ffffffffffffff48,AVar3);
  local_40 = (1 << ((byte)in_RDI->quantization_bits_ & 0x1f)) + -1;
  Quantizer::Quantizer(&local_44);
  range = AttributeQuantizationTransform::range(in_RDI);
  Quantizer::Init(&local_44,range,local_40);
  local_48 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_2c;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  operator_new__(uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40,
             (float *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_54 = 0;
  while( true ) {
    sVar5 = std::
            vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            ::size(local_18);
    if (sVar5 <= local_54) break;
    this_00 = local_10;
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::operator[](local_18,(ulong)local_54);
    AVar3 = PointAttribute::mapped_index
                      ((PointAttribute *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (uint)in_stack_ffffffffffffff40);
    out_data = local_10;
    std::unique_ptr<float[],_std::default_delete<float[]>_>::get
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40);
    GeometryAttribute::GetValue(this_00,AVar3,out_data);
    for (local_74 = 0; local_74 < (int)local_2c; local_74 = local_74 + 1) {
      pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                          in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff3c = *pfVar6;
      in_stack_ffffffffffffff40 = min_values(in_RDI);
      std::vector<float,_std::allocator<float>_>::operator[]
                (in_stack_ffffffffffffff40,(long)local_74);
      in_stack_ffffffffffffff38 =
           Quantizer::QuantizeFloat
                     ((Quantizer *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      *(int32_t *)(local_38 + (long)local_48 * 4) = in_stack_ffffffffffffff38;
      local_48 = local_48 + 1;
    }
    local_54 = local_54 + 1;
  }
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void AttributeQuantizationTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    int num_points, PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  const int num_components = attribute.num_components();

  // Quantize all values using the order given by point_ids.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  const uint32_t max_quantized_value = (1 << (quantization_bits_)) - 1;
  Quantizer quantizer;
  quantizer.Init(range(), max_quantized_value);
  int32_t dst_index = 0;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  for (uint32_t i = 0; i < point_ids.size(); ++i) {
    const AttributeValueIndex att_val_id = attribute.mapped_index(point_ids[i]);
    attribute.GetValue(att_val_id, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      const float value = (att_val[c] - min_values()[c]);
      const int32_t q_val = quantizer.QuantizeFloat(value);
      portable_attribute_data[dst_index++] = q_val;
    }
  }
}